

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_rewriter.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::ExpressionRewriter::ApplyRules
          (ExpressionRewriter *this,LogicalOperator *op,
          vector<std::reference_wrapper<duckdb::Rule>,_true> *rules,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr,
          bool *changes_made,bool is_root)

{
  pointer prVar1;
  bool *changes_made_00;
  int iVar2;
  pointer pEVar3;
  type pEVar4;
  pointer pEVar5;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var6;
  pointer prVar7;
  bool rule_made_change;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_a0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_98;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_90;
  bool *local_88;
  LogicalOperator *local_80;
  string alias;
  vector<std::reference_wrapper<duckdb::Expression>,_true> bindings;
  
  prVar7 = (rules->
           super_vector<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
           ).
           super__Vector_base<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  prVar1 = (rules->
           super_vector<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
           ).
           super__Vector_base<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_98._M_head_impl = (Expression *)this;
  local_88 = changes_made;
  local_80 = op;
  do {
    if (prVar7 == prVar1) {
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(expr);
      alias.field_2._M_allocated_capacity = 0;
      alias.field_2._8_8_ = 0;
      alias._M_dataplus._M_p = (pointer)0x0;
      alias._M_string_length = 0;
      alias._M_dataplus._M_p = (pointer)operator_new(0x18);
      *(LogicalOperator **)alias._M_dataplus._M_p = local_80;
      *(vector<std::reference_wrapper<duckdb::Rule>,_true> **)(alias._M_dataplus._M_p + 8) = rules;
      *(bool **)(alias._M_dataplus._M_p + 0x10) = local_88;
      alias.field_2._8_8_ =
           ::std::
           _Function_handler<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/optimizer/expression_rewriter.cpp:41:47)>
           ::_M_invoke;
      alias.field_2._M_allocated_capacity =
           (size_type)
           ::std::
           _Function_handler<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/optimizer/expression_rewriter.cpp:41:47)>
           ::_M_manager;
      ExpressionIterator::EnumerateChildren
                (pEVar4,(function<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&)>
                         *)&alias);
      ::std::_Function_base::~_Function_base((_Function_base *)&alias);
      ((local_98._M_head_impl)->super_BaseExpression)._vptr_BaseExpression =
           (_func_int **)
           (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
           _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
             (__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
             local_98._M_head_impl;
    }
    bindings.
    super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bindings.
    super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    bindings.
    super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pEVar3 = unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
             ::operator->(&prVar7->_M_data->root);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(expr);
    iVar2 = (*pEVar3->_vptr_ExpressionMatcher[2])
                      (pEVar3,pEVar4,
                       (_Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
                        *)&bindings);
    if ((char)iVar2 != '\0') {
      rule_made_change = false;
      pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(expr);
      ::std::__cxx11::string::string
                ((string *)&alias,(string *)&(pEVar5->super_BaseExpression).alias);
      (*prVar7->_M_data->_vptr_Rule[2])
                (&local_a0,prVar7->_M_data,local_80,
                 (_Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
                  *)&bindings,&rule_made_change);
      changes_made_00 = local_88;
      _Var6._M_head_impl = local_98._M_head_impl;
      if (local_a0._M_head_impl != (Expression *)0x0) {
        *local_88 = true;
        local_90._M_head_impl = local_a0._M_head_impl;
        if (alias._M_string_length != 0) {
          pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                               *)&local_a0);
          _Var6._M_head_impl = local_98._M_head_impl;
          ::std::__cxx11::string::operator=
                    ((string *)&(pEVar5->super_BaseExpression).alias,(string *)&alias);
          local_90._M_head_impl = local_a0._M_head_impl;
        }
        local_a0._M_head_impl = (Expression *)0x0;
        ApplyRules((ExpressionRewriter *)_Var6._M_head_impl,local_80,rules,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_90,changes_made_00,false);
        if (local_90._M_head_impl != (Expression *)0x0) {
          (*((local_90._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_90._M_head_impl = (Expression *)0x0;
        if (local_a0._M_head_impl != (Expression *)0x0) {
          (*((local_a0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
LAB_015bfe04:
        ::std::__cxx11::string::~string((string *)&alias);
        ::std::
        _Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
        ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
                         *)&bindings);
        return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)
               _Var6._M_head_impl;
      }
      if (rule_made_change == true) {
        *local_88 = true;
        ((local_98._M_head_impl)->super_BaseExpression)._vptr_BaseExpression =
             (_func_int **)
             (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
             _M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        goto LAB_015bfe04;
      }
      ::std::__cxx11::string::~string((string *)&alias);
    }
    ::std::
    _Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
    ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
                     *)&bindings);
    prVar7 = prVar7 + 1;
  } while( true );
}

Assistant:

unique_ptr<Expression> ExpressionRewriter::ApplyRules(LogicalOperator &op, const vector<reference<Rule>> &rules,
                                                      unique_ptr<Expression> expr, bool &changes_made, bool is_root) {
	for (auto &rule : rules) {
		vector<reference<Expression>> bindings;
		if (rule.get().root->Match(*expr, bindings)) {
			// the rule matches! try to apply it
			bool rule_made_change = false;
			auto alias = expr->alias;
			auto result = rule.get().Apply(op, bindings, rule_made_change, is_root);
			if (result) {
				changes_made = true;
				// the base node changed: the rule applied changes
				// rerun on the new node
				if (!alias.empty()) {
					result->alias = std::move(alias);
				}
				return ExpressionRewriter::ApplyRules(op, rules, std::move(result), changes_made);
			} else if (rule_made_change) {
				changes_made = true;
				// the base node didn't change, but changes were made, rerun
				return expr;
			}
			// else nothing changed, continue to the next rule
			continue;
		}
	}
	// no changes could be made to this node
	// recursively run on the children of this node
	ExpressionIterator::EnumerateChildren(*expr, [&](unique_ptr<Expression> &child) {
		child = ExpressionRewriter::ApplyRules(op, rules, std::move(child), changes_made);
	});
	return expr;
}